

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::UninterpretedOption::Swap(UninterpretedOption *this,UninterpretedOption *other)

{
  double dVar1;
  uint32 uVar2;
  int iVar3;
  string *psVar4;
  uint64 uVar5;
  int64 iVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  
  if (other != this) {
    internal::RepeatedPtrFieldBase::Swap
              (&(this->name_).super_RepeatedPtrFieldBase,&(other->name_).super_RepeatedPtrFieldBase)
    ;
    psVar4 = this->identifier_value_;
    this->identifier_value_ = other->identifier_value_;
    other->identifier_value_ = psVar4;
    uVar5 = this->positive_int_value_;
    this->positive_int_value_ = other->positive_int_value_;
    other->positive_int_value_ = uVar5;
    iVar6 = this->negative_int_value_;
    this->negative_int_value_ = other->negative_int_value_;
    other->negative_int_value_ = iVar6;
    dVar1 = this->double_value_;
    this->double_value_ = other->double_value_;
    other->double_value_ = dVar1;
    psVar4 = this->string_value_;
    this->string_value_ = other->string_value_;
    other->string_value_ = psVar4;
    psVar4 = this->aggregate_value_;
    this->aggregate_value_ = other->aggregate_value_;
    other->aggregate_value_ = psVar4;
    uVar2 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar2;
    pvVar7 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar7;
    iVar3 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar3;
  }
  return;
}

Assistant:

void UninterpretedOption::Swap(UninterpretedOption* other) {
  if (other != this) {
    name_.Swap(&other->name_);
    std::swap(identifier_value_, other->identifier_value_);
    std::swap(positive_int_value_, other->positive_int_value_);
    std::swap(negative_int_value_, other->negative_int_value_);
    std::swap(double_value_, other->double_value_);
    std::swap(string_value_, other->string_value_);
    std::swap(aggregate_value_, other->aggregate_value_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}